

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68020_cpgen(m68k_info *info)

{
  cs_m68k_op *pcVar1;
  cs_m68k *op;
  int iVar2;
  float fVar3;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  cs_m68k_op *pcVar9;
  uint uVar10;
  uint uVar11;
  cs_m68k_op *pcVar12;
  bool bVar13;
  
  if ((info->type & 0x1c) == 0) {
    build_imm(info,0,info->ir);
    return;
  }
  uVar7 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  uVar10 = 0xaaaa;
  if (uVar7 + 2 <= info->code_len) {
    uVar10 = (uint)(ushort)(*(ushort *)(info->code + uVar7) << 8 |
                           *(ushort *)(info->code + uVar7) >> 8);
  }
  info->pc = info->pc + 2;
  uVar8 = uVar10 >> 7 & 7;
  if (((info->ir & 0x3f) == 0) && ((uVar10 & 0xfc00) == 0x5c00)) {
    MCInst_setOpcode(info->inst,0xb3);
    (info->extension).op_count = '\x02';
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
    (info->extension).operands[0].type = M68K_OP_IMM;
    (info->extension).operands[0].address_mode = M68K_AM_IMMEDIATE;
    aVar4.reg_pair.reg_1 = 0;
    aVar4.reg = uVar10 & 0x3f;
    (info->extension).operands[0].field_0 = aVar4;
    goto LAB_0026127b;
  }
  if ((uVar10 >> 0xd) - 6 < 2) {
    uVar8 = uVar10 & 0xff;
    MCInst_setOpcode(info->inst,0xb4);
    (info->extension).op_count = '\x02';
    pcVar1 = (info->extension).operands + 1;
    bVar13 = (uVar10 >> 0xd & 1) == 0;
    pcVar9 = pcVar1;
    if (bVar13) {
      pcVar9 = (info->extension).operands;
    }
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
    pcVar12 = (info->extension).operands;
    if (bVar13) {
      pcVar12 = pcVar1;
    }
    get_ea_mode_op(info,pcVar9,info->ir,0);
    switch(uVar10 >> 0xb & 3) {
    case 0:
      pcVar12->type = M68K_OP_REG_BITS;
      pcVar12->address_mode = M68K_AM_NONE;
      pcVar12->register_bits = uVar8 << 0x10;
      return;
    case 1:
      (pcVar12->field_0).reg = (uVar10 >> 4 & 7) + M68K_REG_D0;
      return;
    case 3:
      return;
    }
    pcVar12->type = M68K_OP_REG_BITS;
    pcVar12->address_mode = M68K_AM_NONE;
    bVar5 = 7;
    if (1 < uVar8) {
      iVar6 = 0x1f;
      uVar10 = uVar8;
      iVar2 = iVar6;
      if (uVar8 != 0) {
        for (; iVar2 = iVar6, uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      do {
        uVar8 = (uVar10 >> 1 & 1) + uVar8 * 2;
        iVar6 = iVar6 + -1;
        uVar10 = uVar10 >> 1;
      } while (iVar6 != 0);
      bVar5 = 7 - (char)iVar2;
    }
    pcVar12->register_bits = (uVar8 << (bVar5 & 0x1f) & 0xff) << 0x10;
    return;
  }
  if ((uVar10 >> 0xd) - 4 < 2) {
    MCInst_setOpcode(info->inst,0xb0);
    (info->extension).op_count = '\x02';
    pcVar1 = (info->extension).operands + 1;
    bVar13 = (uVar10 >> 0xd & 1) == 0;
    pcVar9 = pcVar1;
    if (bVar13) {
      pcVar9 = (info->extension).operands;
    }
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x4;
    pcVar12 = (info->extension).operands;
    if (bVar13) {
      pcVar12 = pcVar1;
    }
    get_ea_mode_op(info,pcVar9,info->ir,4);
    fVar3 = 6.16571e-44;
    if ((((uVar10 >> 0xc & 1) == 0) && (fVar3 = 6.30584e-44, (uVar10 >> 0xb & 1) == 0)) &&
       (fVar3 = 6.44597e-44, (uVar10 >> 10 & 1) == 0)) {
      return;
    }
    (pcVar12->field_0).simm = fVar3;
    return;
  }
  uVar11 = uVar10 & 0x3b;
  if ((uVar10 & 0x40) == 0) {
    uVar11 = uVar10 & 0x3f;
  }
  bVar5 = 1;
  switch(uVar11) {
  case 0:
    uVar11 = 0xb0;
    goto LAB_002615cc;
  case 1:
    bVar5 = 1;
    uVar11 = 0xa9;
    break;
  case 2:
    bVar5 = 1;
    uVar11 = 0xc4;
    break;
  case 3:
    bVar5 = 1;
    uVar11 = 0xaa;
    break;
  case 4:
    bVar5 = 1;
    uVar11 = 0xc5;
    break;
  default:
    goto switchD_002613e5_caseD_5;
  case 6:
    bVar5 = 1;
    uVar11 = 0xae;
    break;
  case 8:
    bVar5 = 1;
    uVar11 = 0xa6;
    break;
  case 9:
  case 0xd:
    bVar5 = 1;
    uVar11 = 0x5e;
    break;
  case 10:
    bVar5 = 1;
    uVar11 = 0x5d;
    break;
  case 0xc:
    bVar5 = 1;
    uVar11 = 0x5c;
    break;
  case 0xe:
    bVar5 = 1;
    uVar11 = 0xc2;
    break;
  case 0xf:
    bVar5 = 1;
    uVar11 = 0xeb;
    break;
  case 0x10:
    bVar5 = 1;
    uVar11 = 0xa5;
    break;
  case 0x11:
    bVar5 = 1;
    uVar11 = 0x10f;
    break;
  case 0x12:
    bVar5 = 1;
    uVar11 = 0xed;
    break;
  case 0x14:
    bVar5 = 1;
    uVar11 = 0xad;
    break;
  case 0x15:
    bVar5 = 1;
    uVar11 = 0xab;
    break;
  case 0x16:
    bVar5 = 1;
    uVar11 = 0xac;
    break;
  case 0x18:
    bVar5 = 1;
    uVar11 = 0x55;
    break;
  case 0x19:
    bVar5 = 1;
    uVar11 = 0x81;
    break;
  case 0x1a:
    bVar5 = 1;
    uVar11 = 0xb8;
    break;
  case 0x1c:
    bVar5 = 1;
    uVar11 = 0x58;
    break;
  case 0x1d:
    bVar5 = 1;
    uVar11 = 0x80;
    break;
  case 0x1e:
    bVar5 = 1;
    uVar11 = 0xa7;
    break;
  case 0x1f:
    bVar5 = 1;
    uVar11 = 0xa8;
    break;
  case 0x20:
    uVar11 = 0xa2;
    goto LAB_002615cc;
  case 0x21:
    uVar11 = 0xaf;
    goto LAB_002615cc;
  case 0x22:
    uVar11 = 0x59;
    goto LAB_002615cc;
  case 0x23:
    uVar11 = 0xb5;
    goto LAB_002615cc;
  case 0x24:
    uVar11 = 0xc0;
    goto LAB_002615cc;
  case 0x25:
    bVar5 = 1;
    uVar11 = 0xbc;
    break;
  case 0x26:
    bVar5 = 1;
    uVar11 = 0xbf;
    break;
  case 0x27:
    bVar5 = 1;
    uVar11 = 0xc1;
    break;
  case 0x28:
    uVar11 = 0xe8;
    goto LAB_002615cc;
  case 0x38:
    uVar11 = 0x7f;
LAB_002615cc:
    bVar5 = 0;
    break;
  case 0x3a:
    bVar5 = 1;
    uVar11 = 0x10e;
  }
  MCInst_setOpcode(info->inst,uVar11);
switchD_002613e5_caseD_5:
  uVar11 = uVar10 >> 10 & 7;
  if ((uVar10 & 0x40) != 0) {
    info->inst->Opcode = (info->inst->Opcode - (uint)((uVar10 & 4) == 0)) + 2;
  }
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
  if ((bool)(uVar11 == uVar8 & (uVar10 >> 0xe & 1) == 0 & bVar5)) {
    (info->extension).op_count = '\x01';
    (info->extension).operands[0].field_0.reg = uVar11 + M68K_REG_FP0;
    return;
  }
  op = &info->extension;
  if ((uVar10 >> 0xe & 1) == 0) {
    op->operands[0].field_0.reg = uVar11 + M68K_REG_FP0;
    goto LAB_0026127b;
  }
  switch(uVar11) {
  case 0:
    (info->extension).op_size.field_1.cpu_size = M68K_CPU_SIZE_LONG;
    uVar10 = info->ir;
    uVar11 = 4;
    break;
  case 1:
    (info->extension).op_size.type = M68K_SIZE_TYPE_FPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x4;
    get_ea_mode_op(info,op->operands,info->ir,4);
    (info->extension).operands[0].type = M68K_OP_FP_SINGLE;
    goto LAB_0026127b;
  default:
    (info->extension).op_size.type = M68K_SIZE_TYPE_FPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0xc;
    goto LAB_0026127b;
  case 4:
    (info->extension).op_size.field_1.cpu_size = M68K_CPU_SIZE_WORD;
    uVar10 = info->ir;
    uVar11 = 2;
    break;
  case 5:
    (info->extension).op_size.type = M68K_SIZE_TYPE_FPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x8;
    get_ea_mode_op(info,op->operands,info->ir,8);
    (info->extension).operands[0].type = M68K_OP_FP_DOUBLE;
    goto LAB_0026127b;
  case 6:
    (info->extension).op_size.field_1.cpu_size = M68K_CPU_SIZE_BYTE;
    uVar10 = info->ir;
    uVar11 = 1;
  }
  get_ea_mode_op(info,op->operands,uVar10,uVar11);
LAB_0026127b:
  (info->extension).operands[1].field_0.reg = uVar8 + M68K_REG_FP0;
  return;
}

Assistant:

static void d68020_cpgen(m68k_info *info)
{
	cs_m68k *ext;
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	bool supports_single_op;
	uint next;
	int rm, src, dst, opmode;


	LIMIT_CPU_TYPES(info, M68020_PLUS);

	supports_single_op = true;

	next = read_imm_16(info);

	rm = (next >> 14) & 0x1;
	src = (next >> 10) & 0x7;
	dst = (next >> 7) & 0x7;
	opmode = next & 0x3f;

	// special handling for fmovecr

	if (BITFIELD(info->ir, 5, 0) == 0 && BITFIELD(next, 15, 10) == 0x17) {
		cs_m68k_op* op0;
		cs_m68k_op* op1;
		cs_m68k* ext = build_init_op(info, M68K_INS_FMOVECR, 2, 0);

		op0 = &ext->operands[0];
		op1 = &ext->operands[1];

		op0->address_mode = M68K_AM_IMMEDIATE;
		op0->type = M68K_OP_IMM;
		op0->imm = next & 0x3f;

		op1->reg = M68K_REG_FP0 + ((next >> 7) & 7);

		return;
	}

	// deal with extended move stuff

	switch ((next >> 13) & 0x7) {
		// fmovem fpcr
		case 0x4:	// FMOVEM ea, FPCR
		case 0x5:	// FMOVEM FPCR, ea
			fmove_fpcr(info, next);
			return;

		// fmovem list
		case 0x6:
		case 0x7:
			fmovem(info, next);
			return;
	}

	// See comment bellow on why this is being done

	if ((next >> 6) & 1)
		opmode &= ~4;

	// special handling of some instructions here

	switch (opmode) {
		case 0x00: MCInst_setOpcode(info->inst, M68K_INS_FMOVE); supports_single_op = false; break;
		case 0x01: MCInst_setOpcode(info->inst, M68K_INS_FINT); break;
		case 0x02: MCInst_setOpcode(info->inst, M68K_INS_FSINH); break;
		case 0x03: MCInst_setOpcode(info->inst, M68K_INS_FINTRZ); break;
		case 0x04: MCInst_setOpcode(info->inst, M68K_INS_FSQRT); break;
		case 0x06: MCInst_setOpcode(info->inst, M68K_INS_FLOGNP1); break;
		case 0x08: MCInst_setOpcode(info->inst, M68K_INS_FETOXM1); break;
		case 0x09: MCInst_setOpcode(info->inst, M68K_INS_FATANH); break;
		case 0x0a: MCInst_setOpcode(info->inst, M68K_INS_FATAN); break;
		case 0x0c: MCInst_setOpcode(info->inst, M68K_INS_FASIN); break;
		case 0x0d: MCInst_setOpcode(info->inst, M68K_INS_FATANH); break;
		case 0x0e: MCInst_setOpcode(info->inst, M68K_INS_FSIN); break;
		case 0x0f: MCInst_setOpcode(info->inst, M68K_INS_FTAN); break;
		case 0x10: MCInst_setOpcode(info->inst, M68K_INS_FETOX); break;
		case 0x11: MCInst_setOpcode(info->inst, M68K_INS_FTWOTOX); break;
		case 0x12: MCInst_setOpcode(info->inst, M68K_INS_FTENTOX); break;
		case 0x14: MCInst_setOpcode(info->inst, M68K_INS_FLOGN); break;
		case 0x15: MCInst_setOpcode(info->inst, M68K_INS_FLOG10); break;
		case 0x16: MCInst_setOpcode(info->inst, M68K_INS_FLOG2); break;
		case 0x18: MCInst_setOpcode(info->inst, M68K_INS_FABS); break;
		case 0x19: MCInst_setOpcode(info->inst, M68K_INS_FCOSH); break;
		case 0x1a: MCInst_setOpcode(info->inst, M68K_INS_FNEG); break;
		case 0x1c: MCInst_setOpcode(info->inst, M68K_INS_FACOS); break;
		case 0x1d: MCInst_setOpcode(info->inst, M68K_INS_FCOS); break;
		case 0x1e: MCInst_setOpcode(info->inst, M68K_INS_FGETEXP); break;
		case 0x1f: MCInst_setOpcode(info->inst, M68K_INS_FGETMAN); break;
		case 0x20: MCInst_setOpcode(info->inst, M68K_INS_FDIV); supports_single_op = false; break;
		case 0x21: MCInst_setOpcode(info->inst, M68K_INS_FMOD); supports_single_op = false; break;
		case 0x22: MCInst_setOpcode(info->inst, M68K_INS_FADD); supports_single_op = false; break;
		case 0x23: MCInst_setOpcode(info->inst, M68K_INS_FMUL); supports_single_op = false; break;
		case 0x24: MCInst_setOpcode(info->inst, M68K_INS_FSGLDIV); supports_single_op = false; break;
		case 0x25: MCInst_setOpcode(info->inst, M68K_INS_FREM); break;
		case 0x26: MCInst_setOpcode(info->inst, M68K_INS_FSCALE); break;
		case 0x27: MCInst_setOpcode(info->inst, M68K_INS_FSGLMUL); break;
		case 0x28: MCInst_setOpcode(info->inst, M68K_INS_FSUB); supports_single_op = false; break;
		case 0x38: MCInst_setOpcode(info->inst, M68K_INS_FCMP); supports_single_op = false; break;
		case 0x3a: MCInst_setOpcode(info->inst, M68K_INS_FTST); break;
		default:
			break;
	}

	// Some trickery here! It's not documented but if bit 6 is set this is a s/d opcode and then
	// if bit 2 is set it's a d. As we already have set our opcode in the code above we can just
	// offset it as the following 2 op codes (if s/d is supported) will always be directly after it

	if ((next >> 6) & 1) {
		if ((next >> 2) & 1)
			info->inst->Opcode += 2;
		else
			info->inst->Opcode += 1;
	}

	ext = &info->extension;

	ext->op_count = 2;
	ext->op_size.type = M68K_SIZE_TYPE_CPU;
	ext->op_size.cpu_size = 0;

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	if (rm == 0 && supports_single_op && src == dst) {
		ext->op_count = 1;
		op0->reg = M68K_REG_FP0 + dst;
		return;
	}

	if (rm == 1) {
		switch (src) {
			case 0x00 :
				ext->op_size.cpu_size = M68K_CPU_SIZE_LONG;
				get_ea_mode_op(info, op0, info->ir, 4);
				break;

			case 0x06 :
				ext->op_size.cpu_size = M68K_CPU_SIZE_BYTE;
				get_ea_mode_op(info, op0, info->ir, 1);
				break;

			case 0x04 :
				ext->op_size.cpu_size = M68K_CPU_SIZE_WORD;
				get_ea_mode_op(info, op0, info->ir, 2);
				break;

			case 0x01 :
				ext->op_size.type = M68K_SIZE_TYPE_FPU;
				ext->op_size.fpu_size = M68K_FPU_SIZE_SINGLE;
				get_ea_mode_op(info, op0, info->ir, 4);
				op0->type = M68K_OP_FP_SINGLE;
				break;

			case 0x05:
				ext->op_size.type = M68K_SIZE_TYPE_FPU;
				ext->op_size.fpu_size = M68K_FPU_SIZE_DOUBLE;
				get_ea_mode_op(info, op0, info->ir, 8);
				op0->type = M68K_OP_FP_DOUBLE;
				break;

			default :
				ext->op_size.type = M68K_SIZE_TYPE_FPU;
				ext->op_size.fpu_size = M68K_FPU_SIZE_EXTENDED;
				break;
		}
	} else {
		op0->reg = M68K_REG_FP0 + src;
	}

	op1->reg = M68K_REG_FP0 + dst;
}